

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_retr(Curl_easy *data,curl_off_t filesize)

{
  anon_union_280_3_6d7b35ba_for_proto *pp;
  connectdata *pcVar1;
  FTP *pFVar2;
  CURLcode CVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (data->set).max_filesize;
  if (lVar4 < filesize && lVar4 != 0) {
    Curl_failf(data,"Maximum file size exceeded");
    return CURLE_FILESIZE_EXCEEDED;
  }
  pcVar1 = data->conn;
  pFVar2 = (data->req).p.ftp;
  pp = &pcVar1->proto;
  pFVar2->downloadsize = filesize;
  lVar4 = (data->state).resume_from;
  if (lVar4 == 0) {
    CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(pcVar1->proto).ftpc.file);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    (data->conn->proto).ftpc.state = ' ';
    return CURLE_OK;
  }
  if (filesize == -1) {
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"ftp server doesn\'t support SIZE");
      lVar5 = pFVar2->downloadsize;
LAB_0056818a:
      if (lVar5 == 0) {
        Curl_setup_transfer(data,-1,-1,false,-1);
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"File already completely downloaded");
        }
        pFVar2->transfer = PPTRANSFER_NONE;
        (data->conn->proto).ftpc.state = '\0';
        return CURLE_OK;
      }
    }
    lVar4 = (data->state).resume_from;
LAB_00568213:
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"Instructs server to resume from offset %ld",lVar4);
      lVar4 = (data->state).resume_from;
    }
    CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"REST %ld",lVar4);
    if (CVar3 == CURLE_OK) {
      (data->conn->proto).ftpc.state = '\x1b';
      CVar3 = CURLE_OK;
    }
  }
  else {
    if (lVar4 < 0) {
      if (-filesize == lVar4 || -lVar4 < filesize) {
        pFVar2->downloadsize = -lVar4;
        lVar4 = lVar4 + filesize;
        (data->state).resume_from = lVar4;
        goto LAB_00568213;
      }
    }
    else {
      lVar5 = filesize - lVar4;
      if (lVar4 <= filesize) {
        pFVar2->downloadsize = lVar5;
        goto LAB_0056818a;
      }
    }
    Curl_failf(data,"Offset (%ld) was beyond file size (%ld)",lVar4,filesize);
    CVar3 = CURLE_BAD_DOWNLOAD_RESUME;
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_state_retr(struct Curl_easy *data,
                               curl_off_t filesize)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  DEBUGF(infof(data, "ftp_state_retr()"));
  if(data->set.max_filesize && (filesize > data->set.max_filesize)) {
    failf(data, "Maximum file size exceeded");
    return CURLE_FILESIZE_EXCEEDED;
  }
  ftp->downloadsize = filesize;

  if(data->state.resume_from) {
    /* We always (attempt to) get the size of downloads, so it is done before
       this even when not doing resumes. */
    if(filesize == -1) {
      infof(data, "ftp server doesn't support SIZE");
      /* We couldn't get the size and therefore we can't know if there really
         is a part of the file left to get, although the server will just
         close the connection when we start the connection so it won't cause
         us any harm, just not make us exit as nicely. */
    }
    else {
      /* We got a file size report, so we check that there actually is a
         part of the file left to get, or else we go home.  */
      if(data->state.resume_from< 0) {
        /* We're supposed to download the last abs(from) bytes */
        if(filesize < -data->state.resume_from) {
          failf(data, "Offset (%" CURL_FORMAT_CURL_OFF_T
                ") was beyond file size (%" CURL_FORMAT_CURL_OFF_T ")",
                data->state.resume_from, filesize);
          return CURLE_BAD_DOWNLOAD_RESUME;
        }
        /* convert to size to download */
        ftp->downloadsize = -data->state.resume_from;
        /* download from where? */
        data->state.resume_from = filesize - ftp->downloadsize;
      }
      else {
        if(filesize < data->state.resume_from) {
          failf(data, "Offset (%" CURL_FORMAT_CURL_OFF_T
                ") was beyond file size (%" CURL_FORMAT_CURL_OFF_T ")",
                data->state.resume_from, filesize);
          return CURLE_BAD_DOWNLOAD_RESUME;
        }
        /* Now store the number of bytes we are expected to download */
        ftp->downloadsize = filesize-data->state.resume_from;
      }
    }

    if(ftp->downloadsize == 0) {
      /* no data to transfer */
      Curl_setup_transfer(data, -1, -1, FALSE, -1);
      infof(data, "File already completely downloaded");

      /* Set ->transfer so that we won't get any error in ftp_done()
       * because we didn't transfer the any file */
      ftp->transfer = PPTRANSFER_NONE;
      ftp_state(data, FTP_STOP);
      return CURLE_OK;
    }

    /* Set resume file transfer offset */
    infof(data, "Instructs server to resume from offset %"
          CURL_FORMAT_CURL_OFF_T, data->state.resume_from);

    result = Curl_pp_sendf(data, &ftpc->pp, "REST %" CURL_FORMAT_CURL_OFF_T,
                           data->state.resume_from);
    if(!result)
      ftp_state(data, FTP_RETR_REST);
  }
  else {
    /* no resume */
    result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
    if(!result)
      ftp_state(data, FTP_RETR);
  }

  return result;
}